

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O2

Graph * Omega_h::unmap_graph(Graph *__return_storage_ptr__,LOs *a2b,Graph *b2c)

{
  Alloc *pAVar1;
  Graph *this;
  int size_in;
  ulong uVar2;
  undefined4 *puVar3;
  long lVar4;
  uint uVar5;
  size_t sVar6;
  LOs a2ac;
  Write<int> ac2c;
  LOs b2bc;
  string local_1d8;
  Write<int> local_1b8;
  Write<int> local_1a8;
  Write<int> local_198;
  Graph *local_188;
  Write<int> local_180;
  Write<int> local_170;
  Write<int> local_160;
  Write<int> local_150;
  Write<int> local_140;
  Write<int> local_130;
  Write<int> local_120;
  Read<int> a_degrees;
  Write<int> local_100;
  LOs b_degrees;
  LOs bc2c;
  Write<int> local_d0;
  Write<int> local_c0;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<int> local_90;
  type f;
  
  local_188 = __return_storage_ptr__;
  Write<int>::Write(&b2bc.write_,(Write<int> *)b2c);
  Write<int>::Write(&bc2c.write_,&(b2c->ab2b).write_);
  Write<int>::Write(&local_100,&b2bc.write_);
  std::__cxx11::string::string((string *)&local_1d8,"",(allocator *)&local_d0);
  get_degrees((Omega_h *)&b_degrees,(LOs *)&local_100,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  Write<int>::~Write(&local_100);
  Write<int>::Write(&local_130,&a2b->write_);
  Write<int>::Write(&local_140,&b_degrees.write_);
  unmap<int>((Omega_h *)&local_120,(LOs *)&local_130,(Read<int> *)&local_140,1);
  read<int>((Omega_h *)&a_degrees,&local_120);
  Write<int>::~Write(&local_120);
  Write<int>::~Write(&local_140);
  Write<int>::~Write(&local_130);
  Write<int>::Write(&local_150,&a_degrees.write_);
  std::__cxx11::string::string((string *)&local_1d8,"",(allocator *)&local_d0);
  offset_scan<int>((Omega_h *)&a2ac,(Read<int> *)&local_150,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  Write<int>::~Write(&local_150);
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar6 = pAVar1->size;
  }
  else {
    sVar6 = (ulong)pAVar1 >> 3;
  }
  size_in = Read<int>::last((Read<signed_char> *)&a2ac);
  std::__cxx11::string::string((string *)&local_1d8,"",(allocator *)&local_d0);
  Write<int>::Write(&ac2c,size_in,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  Write<int>::Write((Write<int> *)&f,&a2b->write_);
  Write<int>::Write(&f.b2bc.write_,&b2bc.write_);
  Write<int>::Write(&f.a2ac.write_,&a2ac.write_);
  Write<int>::Write(&f.ac2c,&ac2c);
  Write<int>::Write(&f.bc2c.write_,&bc2c.write_);
  Write<int>::Write(&local_d0,(Write<int> *)&f);
  Write<int>::Write(&local_c0,&f.b2bc.write_);
  Write<int>::Write(&local_b0,&f.a2ac.write_);
  Write<int>::Write(&local_a0,&f.ac2c);
  Write<int>::Write(&local_90,&f.bc2c.write_);
  uVar5 = (uint)(sVar6 >> 2);
  if (0 < (int)uVar5) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_1d8,&local_d0);
    Write<int>::Write((Write<int> *)&local_1d8.field_2,&local_c0);
    Write<int>::Write(&local_1b8,&local_b0);
    Write<int>::Write(&local_1a8,&local_a0);
    Write<int>::Write(&local_198,&local_90);
    entering_parallel = 0;
    for (uVar2 = 0; uVar2 != (uVar5 & 0x7fffffff); uVar2 = uVar2 + 1) {
      puVar3 = (undefined4 *)
               ((long)*(int *)(local_1d8.field_2._8_8_ +
                              (long)*(int *)(local_1d8._M_string_length + uVar2 * 4) * 4) * 4 +
               (long)local_198.shared_alloc_.direct_ptr);
      for (lVar4 = (long)*(int *)((long)local_1b8.shared_alloc_.direct_ptr + uVar2 * 4);
          lVar4 < *(int *)((long)local_1b8.shared_alloc_.direct_ptr + uVar2 * 4 + 4);
          lVar4 = lVar4 + 1) {
        *(undefined4 *)((long)local_1a8.shared_alloc_.direct_ptr + lVar4 * 4) = *puVar3;
        puVar3 = puVar3 + 1;
      }
    }
    unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&local_1d8);
  }
  unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&local_d0);
  Write<int>::Write(&local_160,&a2ac.write_);
  this = local_188;
  Write<int>::Write(&local_180,&ac2c);
  Read<int>::Read((Read<signed_char> *)&local_170,&local_180);
  Graph::Graph(this,(LOs *)&local_160,(LOs *)&local_170);
  Write<int>::~Write(&local_170);
  Write<int>::~Write(&local_180);
  Write<int>::~Write(&local_160);
  unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&ac2c);
  Write<int>::~Write(&a2ac.write_);
  Write<int>::~Write(&a_degrees.write_);
  Write<int>::~Write(&b_degrees.write_);
  Write<int>::~Write(&bc2c.write_);
  Write<int>::~Write(&b2bc.write_);
  return this;
}

Assistant:

Graph unmap_graph(LOs a2b, Graph b2c) {
  auto b2bc = b2c.a2ab;
  auto bc2c = b2c.ab2b;
  auto b_degrees = get_degrees(b2bc);
  auto a_degrees = read(unmap(a2b, b_degrees, 1));
  auto a2ac = offset_scan(a_degrees);
  auto na = a2b.size();
  Write<LO> ac2c(a2ac.last());
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    auto bc = b2bc[b];
    for (auto ac = a2ac[a]; ac < a2ac[a + 1]; ++ac) {
      ac2c[ac] = bc2c[bc++];
    }
  };
  parallel_for(na, f, "unmap_graph");
  return Graph(a2ac, ac2c);
}